

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stat.cc
# Opt level: O0

char * SSL_alert_type_string_long(int value)

{
  char *pcStack_10;
  int value_local;
  
  if (value >> 8 == 1) {
    pcStack_10 = "warning";
  }
  else if (value >> 8 == 2) {
    pcStack_10 = "fatal";
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

const char *SSL_alert_type_string_long(int value) {
  value >>= 8;
  if (value == SSL3_AL_WARNING) {
    return "warning";
  } else if (value == SSL3_AL_FATAL) {
    return "fatal";
  }

  return "unknown";
}